

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O0

bool __thiscall crnlib::qdxt1::update_progress(qdxt1 *this,uint value,uint max_value)

{
  ulong uVar1;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  uint percentage;
  undefined4 local_2c;
  undefined1 local_1;
  
  if (*(long *)(in_RDI + 0x650) == 0) {
    local_1 = true;
  }
  else {
    if (in_EDX == 0) {
      local_2c = 100;
    }
    else {
      local_2c = *(int *)(in_RDI + 0x14) +
                 (in_ESI * *(int *)(in_RDI + 0x18) + (in_EDX >> 1)) / in_EDX;
    }
    if (local_2c == *(int *)(in_RDI + 0x66c)) {
      local_1 = true;
    }
    else {
      *(int *)(in_RDI + 0x66c) = local_2c;
      uVar1 = (**(code **)(in_RDI + 0x650))
                        (*(int *)(in_RDI + 0x660) +
                         (uint)(local_2c * *(int *)(in_RDI + 0x664)) / 100,
                         *(undefined8 *)(in_RDI + 0x658));
      if ((uVar1 & 1) == 0) {
        *(undefined1 *)(in_RDI + 0x10) = 1;
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool qdxt1::update_progress(uint value, uint max_value) {
  if (!m_params.m_pProgress_func)
    return true;

  uint percentage = max_value ? (m_progress_start + (value * m_progress_range + (max_value / 2)) / max_value) : 100;
  if ((int)percentage == m_prev_percentage_complete)
    return true;
  m_prev_percentage_complete = percentage;

  if (!m_params.m_pProgress_func(m_params.m_progress_start + (percentage * m_params.m_progress_range) / 100U, m_params.m_pProgress_data)) {
    m_canceled = true;
    return false;
  }

  return true;
}